

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

int __thiscall p2t::Triangle::EdgeIndex(Triangle *this,Point *p1,Point *p2)

{
  Point *p2_local;
  Point *p1_local;
  Triangle *this_local;
  
  if (this->points_[0] == p1) {
    if (this->points_[1] == p2) {
      return 2;
    }
    if (this->points_[2] == p2) {
      return 1;
    }
  }
  else if (this->points_[1] == p1) {
    if (this->points_[2] == p2) {
      return 0;
    }
    if (this->points_[0] == p2) {
      return 2;
    }
  }
  else if (this->points_[2] == p1) {
    if (this->points_[0] == p2) {
      return 1;
    }
    if (this->points_[1] == p2) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int Triangle::EdgeIndex(const Point* p1, const Point* p2)
{
  if (points_[0] == p1) {
    if (points_[1] == p2) {
      return 2;
    } else if (points_[2] == p2) {
      return 1;
    }
  } else if (points_[1] == p1) {
    if (points_[2] == p2) {
      return 0;
    } else if (points_[0] == p2) {
      return 2;
    }
  } else if (points_[2] == p1) {
    if (points_[0] == p2) {
      return 1;
    } else if (points_[1] == p2) {
      return 0;
    }
  }
  return -1;
}